

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O3

string __thiscall
mjs::anon_unknown_110::array_join(anon_unknown_110 *this,object_ptr *o,wstring_view *sep)

{
  wstring *__return_storage_ptr__;
  uint32_t uVar1;
  undefined8 *puVar2;
  void *pvVar3;
  gc_heap *extraout_RAX;
  gc_heap *extraout_RAX_00;
  gc_heap *pgVar4;
  uint32_t index;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  uint uVar6;
  mjs *this_00;
  string sVar7;
  wstring s;
  gc_heap *local_b8;
  pointer local_b0;
  undefined1 local_a8 [24];
  pointer local_90;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_88;
  anon_unknown_110 *local_78;
  allocation_context *local_70;
  pointer local_68;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_60;
  pointer local_58;
  anon_union_32_5_7b1e0779_for_value_3 local_50;
  
  pgVar4 = (o->super_gc_heap_ptr_untyped).heap_;
  local_70 = (allocation_context *)o;
  puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
  local_b8 = (gc_heap *)0x6;
  local_b0 = (pointer)0x1994d8;
  (**(code **)*puVar2)((value *)&local_58,puVar2);
  uVar1 = to_uint32((value *)&local_58);
  value::destroy((value *)&local_58);
  local_b8 = (gc_heap *)local_a8;
  local_b0 = (pointer)0x0;
  local_a8._0_4_ = 0;
  this_00 = (mjs *)0x0;
  if (uVar1 != 0) {
    __return_storage_ptr__ = (wstring *)(local_a8 + 0x10);
    local_78 = this;
    do {
      if ((int)this_00 != 0) {
        std::__cxx11::wstring::append((wchar_t *)&local_b8,(ulong)sep->_M_str);
      }
      puVar2 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_70);
      index_string_abi_cxx11_(__return_storage_ptr__,this_00,index);
      local_68 = local_90;
      local_60 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                  *)local_a8._16_8_;
      (**(code **)*puVar2)((value *)&local_58,puVar2,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_a8._16_8_ != &local_88) {
        operator_delete((void *)local_a8._16_8_,local_88._M_allocated_capacity * 4 + 4);
      }
      if (null < (value_type)local_58) {
        to_string((mjs *)__return_storage_ptr__,pgVar4,(value *)&local_58);
        pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)__return_storage_ptr__);
        std::__cxx11::wstring::append((wchar_t *)&local_b8,(long)pvVar3 + 4);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)__return_storage_ptr__);
      }
      value::destroy((value *)&local_58);
      uVar6 = (int)this_00 + 1;
      this_00 = (mjs *)(ulong)uVar6;
      this = local_78;
    } while (uVar1 != uVar6);
  }
  local_58 = local_b0;
  local_50.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_b8;
  string::string((string *)this,pgVar4,(wstring_view *)&local_58);
  pgVar4 = extraout_RAX;
  uVar5 = extraout_RDX;
  if (local_b8 != (gc_heap *)local_a8) {
    operator_delete(local_b8,CONCAT44(local_a8._4_4_,local_a8._0_4_) * 4 + 4);
    pgVar4 = extraout_RAX_00;
    uVar5 = extraout_RDX_00;
  }
  sVar7.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar5;
  sVar7.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = pgVar4;
  return (string)sVar7.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string array_join(const object_ptr& o, const std::wstring_view& sep) {
    auto& h = o.heap();
    const uint32_t l = to_uint32(o->get(L"length"));
    std::wstring s;
    for (uint32_t i = 0; i < l; ++i) {
        if (i) s += sep;
        const auto& oi = o->get(index_string(i));
        if (oi.type() != value_type::undefined && oi.type() != value_type::null) {
            s += to_string(h, oi).view();
        }
    }
    return string{h, s};
}